

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RDX;
  undefined8 *in_RSI;
  binary_op_sub *this;
  long *in_RDI;
  bool bVar3;
  float fVar4;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar5 [32];
  undefined8 uVar9;
  __m128 afVar10;
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b0;
  __m256 _outp;
  __m256 _p;
  __m256 _b0_avx;
  int i;
  float *outptr;
  float b0;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_sub op;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  Allocator *in_stack_fffffffffffffb98;
  Mat *in_stack_fffffffffffffba0;
  Mat *in_stack_fffffffffffffba8;
  float local_400 [2];
  float afStack_3f8 [2];
  float local_3f0 [2];
  float afStack_3e8 [2];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  int local_364;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined4 local_348;
  long local_340;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 local_328;
  undefined8 local_320;
  binary_op_sub *local_318;
  float local_30c;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  long local_2e8;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined8 local_2c8;
  float *local_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  binary_op_sub local_299 [9];
  long *local_290;
  undefined8 *local_288;
  long *local_280;
  int local_274;
  long *local_270;
  undefined1 local_265;
  int local_264;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined1 local_22d;
  int local_22c;
  undefined8 *local_220;
  undefined8 *local_210;
  float *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  binary_op_sub *local_1e0;
  float *local_1d8;
  undefined8 local_1d0;
  float afStack_1c8 [4];
  binary_op_sub *local_1b8;
  long *local_1b0;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  binary_op_sub *local_190;
  undefined4 local_184;
  int local_180;
  int local_17c;
  undefined8 *local_178;
  long local_170;
  undefined4 local_164;
  long local_160;
  float *local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  undefined8 *local_140;
  undefined4 local_134;
  long local_130;
  undefined4 local_124;
  long local_120;
  undefined8 *local_100;
  undefined8 *local_f0;
  undefined8 local_b8;
  float local_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_2a0 = *(int *)((long)in_RDI + 0x2c);
  local_2a4 = (int)in_RDI[6];
  local_2a8 = *(int *)((long)in_RDI + 0x34);
  local_2ac = (int)in_RDI[7];
  local_2b0 = (int)in_RDI[3];
  local_2b4 = local_2a0 * local_2a4 * local_2a8 * local_2b0;
  local_290 = in_RDX;
  local_288 = in_RSI;
  local_280 = in_RDI;
  Mat::create_like(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_270 = local_290;
  bVar3 = true;
  if (*local_290 != 0) {
    local_1b0 = local_290;
    bVar3 = local_290[8] * (long)(int)local_290[7] == 0;
  }
  if (bVar3) {
    local_274 = -100;
  }
  else {
    for (local_2b8 = 0; local_2b8 < local_2ac; local_2b8 = local_2b8 + 1) {
      local_258 = &local_308;
      local_144 = *(int *)((long)local_280 + 0x2c);
      local_148 = (int)local_280[6];
      local_14c = *(undefined4 *)((long)local_280 + 0x34);
      local_2c0 = (float *)(*local_280 + local_280[8] * (long)local_2b8 * local_280[2]);
      local_160 = local_280[2];
      local_164 = (undefined4)local_280[3];
      local_170 = local_280[4];
      local_140 = &local_308;
      local_130 = (long)local_144 * (long)local_148 * local_160;
      local_250 = &local_308;
      local_240 = &local_308;
      fVar4 = *(float *)*local_288;
      local_220 = &local_360;
      local_17c = *(int *)((long)local_290 + 0x2c);
      local_180 = (int)local_290[6];
      local_184 = *(undefined4 *)((long)local_290 + 0x34);
      this = (binary_op_sub *)(*local_290 + local_290[8] * (long)local_2b8 * local_290[2]);
      local_198 = local_290[2];
      local_19c = (undefined4)local_290[3];
      local_1a8 = local_290[4];
      local_178 = &local_360;
      local_120 = (long)local_17c * (long)local_180 * local_198;
      local_210 = &local_360;
      local_238 = &local_360;
      local_2d0 = 0;
      local_2d4 = 0;
      local_2d8 = 0;
      local_2dc = 0;
      local_2f0 = 0;
      local_2f8 = 0;
      local_300 = 0;
      local_308 = 0;
      local_b8 = 0;
      local_124 = 0x10;
      local_134 = 0x10;
      local_22c = local_2b8;
      local_22d = 1;
      local_264 = local_2b8;
      local_265 = 1;
      local_2c8 = 0;
      local_2e0 = 0;
      local_360 = 0;
      local_350 = 0;
      local_348 = 0;
      local_338 = 0;
      local_334 = 0;
      local_330 = 0;
      local_32c = 0;
      local_328 = 0;
      local_320 = 0;
      local_358 = 0;
      local_364 = 0;
      auVar1 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar4),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar4),0x30);
      auVar2 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar4),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar4),0x30);
      auVar5._16_16_ = auVar1;
      auVar5._0_16_ = auVar2;
      local_80._0_8_ = auVar2._0_8_;
      local_80._8_8_ = auVar2._8_8_;
      local_80._16_8_ = auVar1._0_8_;
      local_80._24_8_ = auVar1._8_8_;
      local_3a0 = local_80._0_8_;
      uStack_398 = local_80._8_8_;
      uStack_390 = local_80._16_8_;
      uStack_388 = local_80._24_8_;
      local_318 = this;
      local_30c = fVar4;
      local_190 = this;
      local_158 = local_2c0;
      local_100 = local_238;
      local_f0 = local_240;
      local_a4 = fVar4;
      local_80 = auVar5;
      local_50 = fVar4;
      local_4c = fVar4;
      local_48 = fVar4;
      local_44 = fVar4;
      local_40 = fVar4;
      local_3c = fVar4;
      local_38 = fVar4;
      local_34 = fVar4;
      local_340 = local_1a8;
      local_2e8 = local_170;
      for (; local_364 + 7 < local_2b4; local_364 = local_364 + 8) {
        local_208 = local_2c0;
        uVar7 = *(undefined8 *)local_2c0;
        uVar6 = *(undefined8 *)(local_2c0 + 2);
        uVar8 = *(undefined8 *)(local_2c0 + 4);
        uVar9 = *(undefined8 *)(local_2c0 + 6);
        local_3c0 = uVar7;
        uStack_3b8 = uVar6;
        uStack_3b0 = uVar8;
        uStack_3a8 = uVar9;
        BinaryOp_x86_avx_functor::binary_op_sub::func_pack8
                  (this,(__m256 *)CONCAT44(fVar4,in_stack_fffffffffffffb88),
                   in_stack_fffffffffffffb80);
        local_1e0 = local_318;
        *(undefined8 *)local_318 = uVar7;
        *(undefined8 *)(local_318 + 8) = uVar6;
        *(undefined8 *)(local_318 + 0x10) = uVar8;
        *(undefined8 *)(local_318 + 0x18) = uVar9;
        local_2c0 = local_2c0 + 8;
        local_318 = local_318 + 0x20;
        local_3e0 = uVar7;
        uStack_3d8 = uVar6;
        uStack_3d0 = uVar8;
        uStack_3c8 = uVar9;
        local_200 = uVar7;
        uStack_1f8 = uVar6;
        uStack_1f0 = uVar8;
        uStack_1e8 = uVar9;
      }
      local_84 = local_30c;
      local_a0 = local_30c;
      fStack_9c = local_30c;
      fStack_98 = local_30c;
      fStack_94 = local_30c;
      local_3f0[1] = local_30c;
      local_3f0[0] = local_30c;
      afStack_3e8[1] = local_30c;
      afStack_3e8[0] = local_30c;
      for (; local_364 + 3 < local_2b4; local_364 = local_364 + 4) {
        local_1d8 = local_2c0;
        local_400 = *(float (*) [2])local_2c0;
        uVar7 = *(undefined8 *)(local_2c0 + 2);
        afStack_3f8 = (float  [2])uVar7;
        afVar10 = BinaryOp_x86_avx_functor::binary_op_sub::func_pack4
                            (local_299,(__m128 *)local_400,(__m128 *)local_3f0);
        local_1d0 = afVar10._0_8_;
        local_1b8 = local_318;
        *(undefined8 *)local_318 = local_1d0;
        *(undefined8 *)(local_318 + 8) = uVar7;
        local_2c0 = local_2c0 + 4;
        local_318 = local_318 + 0x10;
        afStack_1c8._0_8_ = uVar7;
      }
      for (; local_364 < local_2b4; local_364 = local_364 + 1) {
        fVar4 = BinaryOp_x86_avx_functor::binary_op_sub::func(local_299,local_2c0,&local_30c);
        *(float *)local_318 = fVar4;
        local_2c0 = local_2c0 + 1;
        local_318 = local_318 + 4;
      }
    }
    local_274 = 0;
  }
  return local_274;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}